

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

void expose_parent_dirs(zip *zip,char *name,size_t name_length)

{
  char *pcVar1;
  archive_rb_node *self;
  char *s;
  zip_entry *dir;
  archive_string str;
  size_t name_length_local;
  char *name_local;
  zip *zip_local;
  
  dir = (zip_entry *)0x0;
  str.length = 0;
  str.s = (char *)0x0;
  str.buffer_length = name_length;
  archive_strncat((archive_string *)&dir,name,name_length);
  while (pcVar1 = strrchr((char *)dir,0x2f), pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    self = __archive_rb_tree_find_node(&zip->tree_rsrc,dir);
    if (self == (archive_rb_node *)0x0) break;
    __archive_rb_tree_remove_node(&zip->tree_rsrc,self);
    archive_string_free((archive_string *)(self + 3));
    __archive_rb_tree_insert_node(&zip->tree,self);
  }
  archive_string_free((archive_string *)&dir);
  return;
}

Assistant:

static void
expose_parent_dirs(struct zip *zip, const char *name, size_t name_length)
{
	struct archive_string str;
	struct zip_entry *dir;
	char *s;

	archive_string_init(&str);
	archive_strncpy(&str, name, name_length);
	for (;;) {
		s = strrchr(str.s, '/');
		if (s == NULL)
			break;
		*s = '\0';
		/* Transfer the parent directory from zip->tree_rsrc RB
		 * tree to zip->tree RB tree to expose. */
		dir = (struct zip_entry *)
		    __archive_rb_tree_find_node(&zip->tree_rsrc, str.s);
		if (dir == NULL)
			break;
		__archive_rb_tree_remove_node(&zip->tree_rsrc, &dir->node);
		archive_string_free(&dir->rsrcname);
		__archive_rb_tree_insert_node(&zip->tree, &dir->node);
	}
	archive_string_free(&str);
}